

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_icon.cpp
# Opt level: O0

ComponentIcon * lsim::gui::ComponentIcon::cache(uint32_t id,char *data,size_t len)

{
  mapped_type *this;
  ComponentIcon *pCVar1;
  unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_> local_28;
  size_t local_20;
  size_t len_local;
  char *data_local;
  uint32_t id_local;
  
  local_20 = len;
  len_local = (size_t)data;
  data_local._4_4_ = id;
  std::make_unique<lsim::gui::ComponentIcon,char_const*&,unsigned_long&>
            ((char **)&local_28,&len_local);
  this = std::
         unordered_map<unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>_>
         ::operator[]((unordered_map<unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>_>
                       *)m_icon_cache,(key_type *)((long)&data_local + 4));
  std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>::
  operator=(this,&local_28);
  std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>::
  ~unique_ptr(&local_28);
  pCVar1 = cached(data_local._4_4_);
  return pCVar1;
}

Assistant:

ComponentIcon* ComponentIcon::cache(uint32_t id, const char* data, size_t len) {
	m_icon_cache[id] = std::make_unique<ComponentIcon>(data, len);
	return cached(id);
}